

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
embree::XMLLoader::loadUCharArray
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  bool bVar1;
  int iVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  allocator local_69;
  string local_68;
  string local_48;
  
  this_00 = xml->ptr;
  if (this_00 == (XML *)0x0) {
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::__cxx11::string::string((string *)&local_68,"flags",&local_69);
    XML::parm(&local_48,this_00,&local_68);
    bVar1 = std::operator!=(&local_48,"");
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    if (bVar1) {
      loadBinary<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (__return_storage_ptr__,this,xml);
    }
    else {
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (__return_storage_ptr__,
                 ((long)(xml->ptr->body).
                        super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(xml->ptr->body).
                       super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                       super__Vector_impl_data._M_start) / 0x48);
      lVar4 = 0;
      for (uVar3 = 0;
          uVar3 < (ulong)((long)(__return_storage_ptr__->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(__return_storage_ptr__->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_start); uVar3 = uVar3 + 1) {
        iVar2 = Token::Int((Token *)((long)&((xml->ptr->body).
                                             super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->ty + lVar4)
                          );
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[uVar3] = (uchar)iVar2;
        lVar4 = lVar4 + 0x48;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> XMLLoader::loadUCharArray(const Ref<XML>& xml)
  {
    if (!xml) return std::vector<unsigned char>();

    if (xml->parm("flags") != "") {
      return loadBinary<std::vector<unsigned char>>(xml);
    } 
    else 
    {
      std::vector<unsigned char> data;
      data.resize(xml->body.size());
      for (size_t i=0; i<data.size(); i++) 
        data[i] = (unsigned char)xml->body[i].Int();
      return data;
    }
  }